

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O0

void zPrint_Dense_Matrix(char *what,SuperMatrix *A)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  double *dp;
  int local_28;
  int lda;
  int j;
  int i;
  DNformat *Astore;
  SuperMatrix *A_local;
  char *what_local;
  
  puVar2 = (uint *)A->Store;
  uVar1 = *puVar2;
  printf("\nDense matrix %s:\n",what);
  printf("Stype %d, Dtype %d, Mtype %d\n",(ulong)A->Stype,(ulong)A->Dtype,(ulong)A->Mtype);
  lVar3 = *(long *)(puVar2 + 2);
  printf("nrow %d, ncol %d, lda %d\n",(ulong)(uint)A->nrow,(ulong)(uint)A->ncol,(ulong)uVar1);
  printf("\nnzval: ");
  for (local_28 = 0; local_28 < A->ncol; local_28 = local_28 + 1) {
    for (lda = 0; SBORROW4(lda,A->nrow * 2) != lda + A->nrow * -2 < 0; lda = lda + 1) {
      printf("%f  ",*(undefined8 *)(lVar3 + (long)(int)(lda + local_28 * 2 * uVar1) * 8));
    }
    printf("\n");
  }
  printf("\n");
  fflush(_stdout);
  return;
}

Assistant:

void
zPrint_Dense_Matrix(char *what, SuperMatrix *A)
{
    DNformat     *Astore = (DNformat *) A->Store;
    register int i, j, lda = Astore->lda;
    double       *dp;
    
    printf("\nDense matrix %s:\n", what);
    printf("Stype %d, Dtype %d, Mtype %d\n", A->Stype,A->Dtype,A->Mtype);
    dp = (double *) Astore->nzval;
    printf("nrow %d, ncol %d, lda %d\n", (int)A->nrow, (int)A->ncol, lda);
    printf("\nnzval: ");
    for (j = 0; j < A->ncol; ++j) {
        for (i = 0; i < 2*A->nrow; ++i) printf("%f  ", dp[i + j*2*lda]);
        printf("\n");
    }
    printf("\n");
    fflush(stdout);
}